

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_stream.hpp
# Opt level: O1

void __thiscall
libtorrent::i2p_stream::
async_connect<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (i2p_stream *this,endpoint_type *param_1,
          _Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *h)

{
  pointer pcVar1;
  size_type sVar2;
  size_t sVar3;
  string_view host;
  string_view service;
  wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:134:4),_std::_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
  local_68;
  array<char,_22UL> local_3e;
  
  pcVar1 = (this->super_proxy_base).m_hostname._M_dataplus._M_p;
  sVar2 = (this->super_proxy_base).m_hostname._M_string_length;
  aux::to_string(&local_3e,(long)(this->super_proxy_base).m_port);
  sVar3 = strlen(local_3e._M_elems);
  local_68.m_underlying_handler._M_f = h->_M_f;
  local_68.m_underlying_handler._8_8_ = *(undefined8 *)&h->field_0x8;
  local_68.m_underlying_handler._M_bound_args.
  super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
  super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (h->_M_bound_args).
       super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
       .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl
       .super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68.m_underlying_handler._M_bound_args.
  super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
  super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (h->_M_bound_args).
         super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
         .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>.
         _M_head_impl.
         super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  (h->_M_bound_args).
  super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
  super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (h->_M_bound_args).
  super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
  super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  host._M_str = pcVar1;
  host._M_len = sVar2;
  service._M_str = local_3e._M_elems;
  service._M_len = sVar3;
  local_68.m_handler.this = this;
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_resolve<libtorrent::aux::wrap_allocator_t<libtorrent::i2p_stream::async_connect<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>)::_lambda(boost::system::error_code_const&,boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>)_1_,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>>
            ((basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)&(this->super_proxy_base).m_resolver,host,service,0,&local_68);
  if (local_68.m_underlying_handler._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
      .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.m_underlying_handler._M_bound_args.
               super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
               .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>.
               _M_head_impl.
               super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void async_connect(endpoint_type const&, Handler h)
	{
		// since we don't support regular endpoints, just ignore the one
		// provided and use m_dest.

		// the connect is split up in the following steps:
		// 1. resolve name of proxy server
		// 2. connect to SAM bridge
		// 4 send command message (CONNECT/ACCEPT)

		m_resolver.async_resolve(m_hostname, aux::to_string(m_port).data(), aux::wrap_allocator(
			[this](error_code const& ec, tcp::resolver::results_type ips, Handler hn) {
				do_connect(ec, std::move(ips), std::move(hn));
			}, std::move(h)));
	}